

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

int64_t memory_tree_ns::pick_nearest(memory_tree *b,single_learner *base,uint32_t cn,example *ec)

{
  uint uVar1;
  node *pnVar2;
  size_t sVar3;
  example *peVar4;
  uint *puVar5;
  example *in_RCX;
  uint in_EDX;
  example *in_RDI;
  float fVar6;
  float tmp_s;
  uint32_t loc;
  float score;
  size_t i;
  int64_t max_pos;
  float max_score;
  example *in_stack_ffffffffffffff80;
  example *in_stack_ffffffffffffff90;
  example *in_stack_ffffffffffffff98;
  int oas;
  example *b_00;
  example *ec_00;
  undefined4 in_stack_ffffffffffffffd0;
  float fVar7;
  example *local_8;
  
  pnVar2 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)&(in_RDI->super_example_predict).indices._end
                      ,(ulong)in_EDX);
  sVar3 = v_array<unsigned_int>::size(&pnVar2->examples_index);
  if (sVar3 == 0) {
    local_8 = (example *)0xffffffffffffffff;
  }
  else {
    fVar7 = -3.4028235e+38;
    local_8 = (example *)0xffffffffffffffff;
    b_00 = (example *)0x0;
    while( true ) {
      ec_00 = b_00;
      pnVar2 = v_array<memory_tree_ns::node>::operator[]
                         ((v_array<memory_tree_ns::node> *)
                          &(in_RDI->super_example_predict).indices._end,(ulong)in_EDX);
      peVar4 = (example *)v_array<unsigned_int>::size(&pnVar2->examples_index);
      if (peVar4 <= b_00) break;
      oas = 0;
      pnVar2 = v_array<memory_tree_ns::node>::operator[]
                         ((v_array<memory_tree_ns::node> *)
                          &(in_RDI->super_example_predict).indices._end,(ulong)in_EDX);
      puVar5 = v_array<unsigned_int>::operator[](&pnVar2->examples_index,(size_t)ec_00);
      uVar1 = *puVar5;
      if ((*(int *)((long)&(in_RDI->super_example_predict).feature_space[1].indicies._begin + 4) ==
           1) && ((in_RDI->super_example_predict).feature_space[1].indicies.end_array !=
                  (unsigned_long *)0x0)) {
        peVar4 = in_RDI;
        in_stack_ffffffffffffff90 = in_RCX;
        v_array<example_*>::operator[]
                  ((v_array<example_*> *)
                   &(in_RDI->super_example_predict).feature_space[0].values._end,(ulong)uVar1);
        fVar6 = normalized_linear_prod
                          ((memory_tree *)b_00,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        in_stack_ffffffffffffff98 = in_RCX;
        v_array<example_*>::operator[]
                  ((v_array<example_*> *)
                   &(in_RDI->super_example_predict).feature_space[0].values._end,(ulong)uVar1);
        diag_kronecker_product_test
                  ((example *)CONCAT44(fVar7,in_stack_ffffffffffffffd0),local_8,ec_00,oas);
        sVar3 = (in_RDI->super_example_predict).feature_space[1].space_names.erase_count;
        *(undefined8 *)(sVar3 + 0x6828) = 0x7f7fffff;
        *(float *)(sVar3 + 0x6830) = fVar6;
        LEARNER::learner<char,_example>::predict
                  ((learner<char,_example> *)in_stack_ffffffffffffff90,peVar4,
                   (size_t)in_stack_ffffffffffffff80);
        fVar6 = *(float *)((in_RDI->super_example_predict).feature_space[1].space_names.erase_count
                          + 0x68a8);
      }
      else {
        in_stack_ffffffffffffff80 = in_RCX;
        v_array<example_*>::operator[]
                  ((v_array<example_*> *)
                   &(in_RDI->super_example_predict).feature_space[0].values._end,(ulong)uVar1);
        fVar6 = normalized_linear_prod
                          ((memory_tree *)b_00,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      }
      if (fVar7 < fVar6) {
        local_8 = (example *)(ulong)uVar1;
        fVar7 = fVar6;
      }
      b_00 = (example *)((long)&(ec_00->super_example_predict).indices._begin + 1);
    }
  }
  return (int64_t)local_8;
}

Assistant:

int64_t pick_nearest(memory_tree& b, single_learner& base, const uint32_t cn, example& ec)
    {
        if (b.nodes[cn].examples_index.size() > 0)
        {
            float max_score = -FLT_MAX;
            int64_t max_pos = -1;
            for(size_t i = 0; i < b.nodes[cn].examples_index.size(); i++)
            {
                float score = 0.f;
                uint32_t loc = b.nodes[cn].examples_index[i];

                //do not use reward to update memory tree during the very first pass 
                //(which is for unsupervised training for memory tree)
                if (b.learn_at_leaf == true && b.current_pass >= 1){ 
                    float tmp_s = normalized_linear_prod(b, &ec, b.examples[loc]);
                    diag_kronecker_product_test(ec, *b.examples[loc], *b.kprod_ec, b.oas );
                    b.kprod_ec->l.simple = {FLT_MAX, 0., tmp_s};
                    base.predict(*b.kprod_ec, b.max_routers);
                    score = b.kprod_ec->partial_prediction;
                }
                else
                    score = normalized_linear_prod(b, &ec, b.examples[loc]);
                
                if (score > max_score){
                    max_score = score;
                    max_pos = (int64_t)loc;
                }
            }
            return max_pos;
        }
        else
            return -1;
    }